

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_ecdsa_adaptor.cpp
# Opt level: O2

Privkey * cfd::core::AdaptorUtil::ExtractSecret
                    (Privkey *__return_storage_ptr__,AdaptorSignature *adaptor_sig,
                    ByteData *signature,Pubkey *adaptor)

{
  int iVar1;
  secp256k1_context_struct *ctx;
  CfdException *this;
  string local_100;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> secret;
  secp256k1_ecdsa_signature secp_sig;
  secp256k1_pubkey_conflict secp_adaptor;
  
  ctx = wally_get_secp_context();
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&secret,0x20,
             (allocator_type *)&secp_sig);
  ParseSignature(&secp_sig,signature);
  ParsePubkey(&secp_adaptor,adaptor);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e0,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)adaptor_sig);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_100,
                     (ByteData *)&local_e0);
  iVar1 = secp256k1_ecdsa_adaptor_extract_secret
                    (ctx,secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,&secp_sig,
                     (uchar *)local_100._M_dataplus._M_p,&secp_adaptor);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_100);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_e0);
  if (iVar1 == 1) {
    ByteData::ByteData((ByteData *)&local_100,&secret);
    Privkey::Privkey(__return_storage_ptr__,(ByteData *)&local_100,kMainnet,true);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_100);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return __return_storage_ptr__;
  }
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&local_100,"Could not extract secret.",(allocator *)&local_e0);
  CfdException::CfdException(this,kCfdInternalError,&local_100);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Privkey AdaptorUtil::ExtractSecret(
    const AdaptorSignature &adaptor_sig, const ByteData &signature,
    const Pubkey &adaptor) {
  auto ctx = wally_get_secp_context();
  std::vector<uint8_t> secret(Privkey::kPrivkeySize);
  auto secp_sig = ParseSignature(signature);
  auto secp_adaptor = ParsePubkey(adaptor);
  auto ret = secp256k1_ecdsa_adaptor_extract_secret(
      ctx, secret.data(), &secp_sig, adaptor_sig.GetData().GetBytes().data(),
      &secp_adaptor);

  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not extract secret.");
  }

  return Privkey(ByteData(secret));
}